

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_sv.c
# Opt level: O0

dtl_sv_t * dtl_sv_make_dv(dtl_dv_t *dv,_Bool autoIncRef)

{
  dtl_sv_t *self_00;
  dtl_sv_t *self;
  _Bool autoIncRef_local;
  dtl_dv_t *dv_local;
  
  self_00 = dtl_sv_new();
  if (self_00 != (dtl_sv_t *)0x0) {
    dtl_sv_set_dv(self_00,dv,autoIncRef);
  }
  return self_00;
}

Assistant:

dtl_sv_t *dtl_sv_make_dv(dtl_dv_t *dv, bool autoIncRef)
{
   dtl_sv_t *self = dtl_sv_new();
   if(self)
   {
      dtl_sv_set_dv(self, dv, autoIncRef);
   }
   return self;
}